

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_ssg.cpp
# Opt level: O0

ssize_t __thiscall ymfm::ssg_engine::write(ssg_engine *this,int __fd,void *__buf,size_t __n)

{
  uint32_t uVar1;
  ssg_engine *psVar2;
  undefined4 extraout_var;
  ssize_t sVar3;
  undefined4 extraout_var_00;
  uint8_t data_local;
  uint32_t regnum_local;
  ssg_engine *this_local;
  
  if (this->m_override == (ssg_override *)0x0) {
    psVar2 = (ssg_engine *)
             ssg_registers::write(&this->m_regs,__fd,(void *)((ulong)__buf & 0xff),__n);
    if (__fd == 0xd) {
      this->m_envelope_state = 0;
      psVar2 = this;
    }
    else {
      if (__fd == 0xe) {
        uVar1 = ssg_registers::io_a_out(&this->m_regs);
        psVar2 = (ssg_engine *)CONCAT44(extraout_var,uVar1);
        if (uVar1 != 0) {
          sVar3 = (*(code *)this->m_intf->m_engine[7]._vptr_ymfm_engine_callbacks)
                            (this->m_intf,0,0,(ulong)__buf & 0xff);
          return sVar3;
        }
      }
      if (__fd == 0xf) {
        uVar1 = ssg_registers::io_b_out(&this->m_regs);
        psVar2 = (ssg_engine *)CONCAT44(extraout_var_00,uVar1);
        if (uVar1 != 0) {
          psVar2 = (ssg_engine *)
                   (*(code *)this->m_intf->m_engine[7]._vptr_ymfm_engine_callbacks)
                             (this->m_intf,0,1,(ulong)__buf & 0xff);
        }
      }
    }
  }
  else {
    psVar2 = (ssg_engine *)
             (**(code **)(*(long *)this->m_override + 0x10))
                       (this->m_override,__fd,(ulong)__buf & 0xff);
  }
  return (ssize_t)psVar2;
}

Assistant:

void ssg_engine::write(uint32_t regnum, uint8_t data)
{
	// defer to the override if present
	if (m_override != nullptr)
		return m_override->ssg_write(regnum, data);

	// store the raw value to the register array;
	// most writes are passive, consumed only when needed
	m_regs.write(regnum, data);

	// writes to the envelope shape register reset the state
	if (regnum == 0x0d)
		m_envelope_state = 0;

	// writes to the I/O ports call the handlers if they are configured for output
	else if (regnum == 0x0e && m_regs.io_a_out())
		m_intf.ymfm_external_write(ACCESS_IO, 0, data);
	else if (regnum == 0x0f && m_regs.io_b_out())
		m_intf.ymfm_external_write(ACCESS_IO, 1, data);
}